

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  string *psVar1;
  StringOutputStream local_10;
  
  if (count < 0) {
    BackUp();
  }
  else {
    psVar1 = this->target_;
    if (psVar1 != (string *)0x0) {
      if ((ulong)(uint)count <= psVar1->_M_string_length) {
        std::__cxx11::string::resize((ulong)psVar1,(char)psVar1->_M_string_length - (char)count);
        return;
      }
      goto LAB_00237604;
    }
  }
  BackUp(&local_10);
LAB_00237604:
  BackUp();
}

Assistant:

void StringOutputStream::BackUp(int count) {
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK(target_ != nullptr);
  ABSL_CHECK_LE(static_cast<size_t>(count), target_->size());
  target_->resize(target_->size() - count);
}